

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  xml_node_struct *n;
  
  pxVar1 = (xml_node_struct *)*xn;
  if (pxVar1 != (xml_node_struct *)0x0 && xn[1] == 0) {
    pxVar2 = pxVar1->first_child;
    while ((n = pxVar2, n != (xml_node_struct *)0x0 &&
           (bVar3 = step_push(this,ns,n,alloc), (bVar3 & once) == 0))) {
      pxVar2 = n->first_child;
      if (n->first_child == (xml_node_struct *)0x0) {
        while (pxVar2 = n->next_sibling, n->next_sibling == (xml_node_struct *)0x0) {
          n = n->parent;
          if (n == pxVar1) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}